

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerAdapter.cxx
# Opt level: O0

void __thiscall cmDebugger::SyncEvent::Wait(SyncEvent *this)

{
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  SyncEvent *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->Mutex);
  std::condition_variable::wait<cmDebugger::SyncEvent::Wait()::_lambda()_1_>
            (&this->Cv,(unique_lock<std::mutex> *)local_20,(anon_class_8_1_8991fb9c)this);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void Wait()
  {
    std::unique_lock<std::mutex> lock(Mutex);
    Cv.wait(lock, [&] { return Fired; });
  }